

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_free_hash_table.h
# Opt level: O0

bool __thiscall
neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Update
          (LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL> *this
          ,unsigned_long *key,unsigned_long *newMapped)

{
  size_t sVar1;
  bool bVar2;
  hash<unsigned_long> local_31;
  Locator local_30;
  Locator locator;
  unsigned_long *newMapped_local;
  unsigned_long *key_local;
  LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL> *this_local;
  
  locator.pos = (Node *)newMapped;
  sVar1 = std::hash<unsigned_long>::operator()(&local_31,*key);
  Locator::Locator(&local_30,this,key,newMapped,sVar1);
  bVar2 = true;
  if (local_30.pos != (Node *)0x0) {
    bVar2 = (local_30.pos)->type == Data;
  }
  if (!bVar2) {
    __assert_fail("locator.pos == nullptr || locator.pos->type == NodeType::Data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/test/../neatlib/lock_free_hash_table.h"
                  ,0x14e,
                  "bool neatlib::LockFreeHashTable<unsigned long, unsigned long, std::hash<unsigned long>, 4, 8>::Update(const Key &, const T &) [Key = unsigned long, T = unsigned long, Hash = std::hash<unsigned long>, HASH_LEVEL = 4, ROOT_HASH_LEVEL = 8]"
                 );
  }
  if (local_30.pos != (Node *)0x0) {
    epoch::
    MemoryEpoch<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>,_neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
    ::BumpEpoch(&this->epoch_,local_30.pos,&this->data_pool_);
  }
  else {
    epoch::
    MemoryEpoch<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::Node,_std::vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>,_neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
    ::EnterEpoch(&this->epoch_);
  }
  return local_30.pos != (Node *)0x0;
}

Assistant:

inline bool Update(const Key &key, const T &newMapped) {
        Locator locator(*this, key, newMapped, Hash()(key), update_type());
        assert(locator.pos == nullptr || locator.pos->type == NodeType::Data);
        if (locator.pos == nullptr) {
            epoch_.EnterEpoch();
            return false;
        }
        epoch_.BumpEpoch(static_cast<Node *>(locator.pos), data_pool_);
        return true;
    }